

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBodyDynamicsWorld.cpp
# Opt level: O0

void __thiscall
btMultiBodyDynamicsWorld::btMultiBodyDynamicsWorld
          (btMultiBodyDynamicsWorld *this,btDispatcher *dispatcher,btBroadphaseInterface *pairCache,
          btMultiBodyConstraintSolver *constraintSolver,
          btCollisionConfiguration *collisionConfiguration)

{
  btContactSolverInfo *pbVar1;
  void *pvVar2;
  undefined8 in_RCX;
  btMultiBodyConstraintSolver *in_RDI;
  btCollisionConfiguration *in_stack_00000020;
  btConstraintSolver *in_stack_00000028;
  btBroadphaseInterface *in_stack_00000030;
  btDispatcher *in_stack_00000038;
  btDiscreteDynamicsWorld *in_stack_00000040;
  btAlignedObjectArray<btMultiBody_*> *in_stack_ffffffffffffff90;
  btAlignedObjectArray<float> *dispatcher_00;
  MultiBodyInplaceSolverIslandCallback *this_00;
  
  btDiscreteDynamicsWorld::btDiscreteDynamicsWorld
            (in_stack_00000040,in_stack_00000038,in_stack_00000030,in_stack_00000028,
             in_stack_00000020);
  (in_RDI->super_btSequentialImpulseConstraintSolver).super_btConstraintSolver.
  _vptr_btConstraintSolver = (_func_int **)&PTR__btMultiBodyDynamicsWorld_002e7df0;
  this_00 = (MultiBodyInplaceSolverIslandCallback *)&(in_RDI->m_data).m_deltaVelocitiesUnitImpulse;
  btAlignedObjectArray<btMultiBody_*>::btAlignedObjectArray(in_stack_ffffffffffffff90);
  dispatcher_00 = &(in_RDI->m_data).m_deltaVelocities;
  btAlignedObjectArray<btMultiBodyConstraint_*>::btAlignedObjectArray
            ((btAlignedObjectArray<btMultiBodyConstraint_*> *)in_stack_ffffffffffffff90);
  btAlignedObjectArray<btMultiBodyConstraint_*>::btAlignedObjectArray
            ((btAlignedObjectArray<btMultiBodyConstraint_*> *)in_stack_ffffffffffffff90);
  *(undefined8 *)&(in_RDI->m_data).scratch_v = in_RCX;
  pbVar1 = btDynamicsWorld::getSolverInfo((btDynamicsWorld *)in_RDI);
  (pbVar1->super_btContactSolverInfoData).m_splitImpulse = 0;
  pbVar1 = btDynamicsWorld::getSolverInfo((btDynamicsWorld *)in_RDI);
  *(byte *)&(pbVar1->super_btContactSolverInfoData).m_solverMode =
       (byte)(pbVar1->super_btContactSolverInfoData).m_solverMode | 0x10;
  pvVar2 = ::operator_new(200);
  MultiBodyInplaceSolverIslandCallback::MultiBodyInplaceSolverIslandCallback
            (this_00,in_RDI,(btDispatcher *)dispatcher_00);
  *(void **)&(in_RDI->m_data).scratch_v.m_capacity = pvVar2;
  return;
}

Assistant:

btMultiBodyDynamicsWorld::btMultiBodyDynamicsWorld(btDispatcher* dispatcher,btBroadphaseInterface* pairCache,btMultiBodyConstraintSolver* constraintSolver,btCollisionConfiguration* collisionConfiguration)
	:btDiscreteDynamicsWorld(dispatcher,pairCache,constraintSolver,collisionConfiguration),
	m_multiBodyConstraintSolver(constraintSolver)
{
	//split impulse is not yet supported for Featherstone hierarchies
	getSolverInfo().m_splitImpulse = false;
	getSolverInfo().m_solverMode |=SOLVER_USE_2_FRICTION_DIRECTIONS;
	m_solverMultiBodyIslandCallback = new MultiBodyInplaceSolverIslandCallback(constraintSolver,dispatcher);
}